

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

ssize_t __thiscall kj::Executor::send(Executor *this,int __fd,void *__buf,size_t __n,int __flags)

{
  State *pSVar1;
  Mutex *this_00;
  long *plVar2;
  Maybe<kj::_::XThreadEvent_&> *pMVar3;
  EventLoop *this_01;
  Executor *pEVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  XThreadEvent *this_02;
  undefined4 in_register_00000084;
  long in_FS_OFFSET;
  Locked<kj::Executor::Impl::State> lock;
  Fault f;
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition;
  XThreadEvent *local_28;
  
  this_02 = (XThreadEvent *)CONCAT44(in_register_00000034,__fd);
  _kjCondition.left = &this_02->state;
  _kjCondition.result = this_02->state == UNUSED;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x4fc,FAILED,"event.state == _::XThreadEvent::UNUSED","_kjCondition,",&_kjCondition)
    ;
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((char)__buf == '\0') {
    this_01 = anon_unknown_173::currentEventLoop();
    pEVar4 = EventLoop::getExecutor(this_01);
    (this_02->replyExecutor).ptr = pEVar4;
  }
  else if ((*(long *)(in_FS_OFFSET + -0x28) != 0) &&
          (*(Executor **)(*(long *)(in_FS_OFFSET + -0x28) + 0x48) == this)) {
    (*(this_02->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])
              (&f,this_02,__buf,__n,CONCAT44(in_register_00000084,__flags));
    _kjCondition.result = CONCAT71(f.exception._1_7_,f.exception._0_1_) == 0;
    _kjCondition._8_8_ = &kj::none;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      return 0x59068d;
    }
    _kjCondition.left = (anon_enum_32 *)&f;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&,kj::None_const&>&,char_const(&)[84]>
              ((Fault *)&lock,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x509,FAILED,"promiseNode == kj::none",
               "_kjCondition,\"can\'t call executeSync() on own thread\'s executor with a promise-returning function\""
               ,(DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>_&,_const_kj::None_&>
                 *)&_kjCondition,
               (char (*) [84])
               "can\'t call executeSync() on own thread\'s executor with a promise-returning function"
              );
    kj::_::Debug::Fault::fatal((Fault *)&lock);
  }
  this_00 = (Mutex *)(this->impl).ptr;
  _kjCondition.left = (anon_enum_32 *)((ulong)_kjCondition.left & 0xffffffffffffff00);
  kj::_::Mutex::lock(this_00);
  pSVar1 = (State *)(this_00 + 1);
  plVar2 = *(long **)(this_00 + 1);
  lock.mutex = this_00;
  lock.ptr = pSVar1;
  if (plVar2 == (long *)0x0) {
    kj::_::XThreadEvent::setDisconnected(this_02);
  }
  else {
    this_02->state = QUEUED;
    if ((this_02->targetLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0) {
      kj::_::throwDoubleAdd();
    }
    pMVar3 = (Maybe<kj::_::XThreadEvent_&> *)this_00[1].waitersTail;
    pMVar3->ptr = this_02;
    (this_02->targetLink).prev = pMVar3;
    this_00[1].waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)&this_02->targetLink;
    *(long *)(this_00 + 2) = *(long *)(this_00 + 2) + 1;
    plVar2 = (long *)*plVar2;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x18))();
    }
    if ((char)__buf != '\0') {
      _kjCondition._8_8_ = &local_28;
      _kjCondition.left = (anon_enum_32 *)&PTR_check_006dd8c8;
      f.exception._0_1_ = 0;
      _kjCondition.op.content.ptr = (char *)pSVar1;
      local_28 = this_02;
      kj::_::Mutex::wait(this_00,&_kjCondition);
    }
  }
  kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
  return extraout_RAX;
}

Assistant:

void Executor::send(_::XThreadEvent& event, bool sync) const {
  KJ_ASSERT(event.state == _::XThreadEvent::UNUSED);

  if (sync) {
    EventLoop* thisThread = threadLocalEventLoop;
    if (thisThread != nullptr &&
        thisThread->executor.map([this](auto& e) { return e == this; }).orDefault(false)) {
      // Invoking a sync request on our own thread. Just execute it directly; if we try to queue
      // it to the loop, we'll deadlock.
      auto promiseNode = event.execute();

      // If the function returns a promise, we have no way to pump the event loop to wait for it,
      // because the event loop may already be pumping somewhere up the stack.
      KJ_ASSERT(promiseNode == kj::none,
          "can't call executeSync() on own thread's executor with a promise-returning function");

      return;
    }
  } else {
    event.replyExecutor = getCurrentThreadExecutor();

    // Note that async requests will "just work" even if the target executor is our own thread's
    // executor. In theory we could detect this case to avoid some locking and signals but that
    // would be extra code complexity for probably little benefit.
  }

  auto lock = impl->state.lockExclusive();
  const EventLoop* loop;
  KJ_IF_SOME(l, lock->loop) {
    loop = &l;
  } else {
    event.setDisconnected();
    return;
  }